

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

pair<EigenAnswer,_double> * task2(pair<EigenAnswer,_double> *__return_storage_ptr__,Matrix *A)

{
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  duration<long,_std::ratio<1L,_1000L>_> local_68;
  rep local_60;
  rep local_58;
  undefined1 local_50 [8];
  EigenAnswer ans;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  Matrix *A_local;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_28);
  ans.value = (double)std::chrono::_V2::system_clock::now();
  end.__d.__r = (duration)(duration)ans.value;
  PowerIterationMethod((EigenAnswer *)local_50,A,&it);
  local_58 = std::chrono::_V2::system_clock::now();
  local_28.__d.__r = (duration)(duration)local_58;
  local_70.__r = (rep)std::chrono::operator-(&local_28,&end);
  local_68.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_70);
  local_60 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_68);
  std::pair<EigenAnswer,_double>::pair<EigenAnswer_&,_long,_true>
            (__return_storage_ptr__,(EigenAnswer *)local_50,&local_60);
  EigenAnswer::~EigenAnswer((EigenAnswer *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<EigenAnswer, double> task2(const Matrix &A)
{
    std::chrono::time_point<std::chrono::high_resolution_clock> start, end;

    start = std::chrono::high_resolution_clock::now();
    auto ans = PowerIterationMethod(A);
    end = std::chrono::high_resolution_clock::now();

    return {ans, std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count()};
}